

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int YUY2ToI422(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,
              int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  undefined4 in_R10D;
  int iVar5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(src_yuy2 == (uint8_t *)0x0);
  auVar9._4_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  auVar9._8_4_ = -(uint)(dst_u == (uint8_t *)0x0);
  auVar9._12_4_ = -(uint)(dst_v == (uint8_t *)0x0);
  iVar5 = movmskps(in_R10D,auVar9);
  iVar2 = -1;
  if ((height != 0 && 0 < width) && iVar5 == 0) {
    iVar5 = height;
    if (height < 0) {
      iVar5 = -height;
      src_yuy2 = src_yuy2 + ~height * src_stride_yuy2;
      src_stride_yuy2 = -src_stride_yuy2;
    }
    if ((dst_stride_v * 2 == width &&
         ((dst_stride_u * 2 == width && dst_stride_y == width) && width * 2 == src_stride_yuy2)) &&
       (uVar1 = iVar5 * width, (int)uVar1 < 0x8001)) {
      iVar5 = 1;
      src_stride_yuy2 = 0;
      dst_stride_y = 0;
      dst_stride_u = 0;
      dst_stride_v = 0;
      width = uVar1;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    bVar8 = (width & 0xfU) == 0;
    pcVar4 = YUY2ToUV422Row_Any_SSE2;
    if (bVar8) {
      pcVar4 = YUY2ToUV422Row_SSE2;
    }
    pcVar7 = YUY2ToYRow_Any_SSE2;
    if (bVar8) {
      pcVar7 = YUY2ToYRow_SSE2;
    }
    if ((uVar1 & 0x20) == 0) {
      pcVar4 = YUY2ToUV422Row_C;
      pcVar7 = YUY2ToYRow_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    bVar8 = (width & 0x1fU) == 0;
    pcVar6 = YUY2ToUV422Row_Any_AVX2;
    if (bVar8) {
      pcVar6 = YUY2ToUV422Row_AVX2;
    }
    pcVar3 = YUY2ToYRow_Any_AVX2;
    if (bVar8) {
      pcVar3 = YUY2ToYRow_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar3 = pcVar7;
      pcVar6 = pcVar4;
    }
    iVar2 = 0;
    if (0 < iVar5) {
      do {
        (*pcVar6)(src_yuy2,dst_u,dst_v,width);
        (*pcVar3)(src_yuy2,dst_y,width);
        src_yuy2 = src_yuy2 + src_stride_yuy2;
        dst_y = dst_y + dst_stride_y;
        dst_u = dst_u + dst_stride_u;
        dst_v = dst_v + dst_stride_v;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int YUY2ToI422(const uint8_t* src_yuy2,
               int src_stride_yuy2,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int y;
  void (*YUY2ToUV422Row)(const uint8_t* src_yuy2, uint8_t* dst_u,
                         uint8_t* dst_v, int width) = YUY2ToUV422Row_C;
  void (*YUY2ToYRow)(const uint8_t* src_yuy2, uint8_t* dst_y, int width) =
      YUY2ToYRow_C;
  if (!src_yuy2 || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
  // Coalesce rows.
  if (src_stride_yuy2 == width * 2 && dst_stride_y == width &&
      dst_stride_u * 2 == width && dst_stride_v * 2 == width &&
      width * height <= 32768) {
    width *= height;
    height = 1;
    src_stride_yuy2 = dst_stride_y = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_YUY2TOYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    YUY2ToUV422Row = YUY2ToUV422Row_Any_SSE2;
    YUY2ToYRow = YUY2ToYRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToUV422Row = YUY2ToUV422Row_SSE2;
      YUY2ToYRow = YUY2ToYRow_SSE2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    YUY2ToUV422Row = YUY2ToUV422Row_Any_AVX2;
    YUY2ToYRow = YUY2ToYRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToUV422Row = YUY2ToUV422Row_AVX2;
      YUY2ToYRow = YUY2ToYRow_AVX2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    YUY2ToYRow = YUY2ToYRow_Any_NEON;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToYRow = YUY2ToYRow_NEON;
      YUY2ToUV422Row = YUY2ToUV422Row_NEON;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MMI) && defined(HAS_YUY2TOUV422ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    YUY2ToYRow = YUY2ToYRow_Any_MMI;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      YUY2ToYRow = YUY2ToYRow_MMI;
      YUY2ToUV422Row = YUY2ToUV422Row_MMI;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MSA) && defined(HAS_YUY2TOUV422ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    YUY2ToYRow = YUY2ToYRow_Any_MSA;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToYRow = YUY2ToYRow_MSA;
      YUY2ToUV422Row = YUY2ToUV422Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    YUY2ToUV422Row(src_yuy2, dst_u, dst_v, width);
    YUY2ToYRow(src_yuy2, dst_y, width);
    src_yuy2 += src_stride_yuy2;
    dst_y += dst_stride_y;
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
  }
  return 0;
}